

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XSObjectFactory::processFacets
          (XSObjectFactory *this,DatatypeValidator *dv,XSModel *xsModel,XSSimpleTypeDefinition *xsST
          )

{
  short *psVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  FACET FVar4;
  MemoryManager *pMVar5;
  DatatypeValidator *pDVar6;
  BaseRefVectorOf<xercesc_4_0::XSObject> *pBVar7;
  BaseRefVectorOf<xercesc_4_0::XSFacet> *this_00;
  BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *this_01;
  int iVar8;
  FACET FVar9;
  uint uVar10;
  XMLSize_t index;
  BaseRefVectorOf<xercesc_4_0::XSFacet> *this_02;
  undefined4 extraout_var;
  long lVar11;
  BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *this_03;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XSMultiValueFacet *pXVar12;
  XSAnnotation *pXVar13;
  KVStringPair *key;
  XMLCh *pXVar14;
  XSFacet *pXVar15;
  XMLCh *pXVar16;
  char16_t *__dest;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  byte bVar17;
  XMLCh *pXVar18;
  FACET facetKind;
  XMLSize_t XVar19;
  ulong uVar20;
  FACET fixedFacets;
  size_t __n;
  bool bVar21;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> e;
  XMLStringTokenizer tokenizer;
  FACET local_104;
  BaseRefVectorOf<char16_t> *local_e8;
  FACET local_dc;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> local_90;
  XMLStringTokenizer local_60;
  undefined4 extraout_var_02;
  
  uVar10 = dv->fFacetsDefined;
  FVar4 = dv->fFixed;
  this_02 = (BaseRefVectorOf<xercesc_4_0::XSFacet> *)
            XMemory::operator_new(0x30,this->fMemoryManager);
  pMVar5 = this->fMemoryManager;
  this_02->_vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_00415f88;
  this_02->fAdoptedElems = false;
  this_02->fCurCount = 0;
  this_02->fMaxCount = 4;
  this_02->fElemList = (XSFacet **)0x0;
  this_02->fMemoryManager = pMVar5;
  iVar8 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,0x20);
  this_02->fElemList = (XSFacet **)CONCAT44(extraout_var,iVar8);
  lVar11 = 0;
  do {
    this_02->fElemList[lVar11] = (XSFacet *)0x0;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4);
  this_02->_vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_00415f10;
  bVar21 = dv != (DatatypeValidator *)0x0;
  if (bVar21) {
    bVar17 = (byte)dv->fFacetsDefined;
    pDVar6 = dv;
    while ((bVar17 & 0x18) == 0) {
      pDVar6 = pDVar6->fBaseValidator;
      bVar21 = pDVar6 != (DatatypeValidator *)0x0;
      if (pDVar6 == (DatatypeValidator *)0x0) break;
      bVar17 = (byte)pDVar6->fFacetsDefined;
    }
  }
  fixedFacets = FACET_NONE;
  if (bVar21) {
    this_03 = (BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)
              XMemory::operator_new(0x30,this->fMemoryManager);
    pMVar5 = this->fMemoryManager;
    this_03->_vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_00416048;
    this_03->fAdoptedElems = false;
    this_03->fCurCount = 0;
    this_03->fMaxCount = 2;
    this_03->fElemList = (XSMultiValueFacet **)0x0;
    this_03->fMemoryManager = pMVar5;
    iVar8 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,0x10);
    this_03->fElemList = (XSMultiValueFacet **)CONCAT44(extraout_var_00,iVar8);
    lVar11 = 0;
    do {
      this_03->fElemList[lVar11] = (XSMultiValueFacet *)0x0;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 2);
    this_03->_vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_00415fd0;
  }
  else {
    this_03 = (BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)0x0;
  }
  local_dc = FACET_NONE;
  local_104 = FACET_NONE;
  if ((uVar10 & 0x10) != 0) {
    iVar8 = (*(dv->super_XSerializable)._vptr_XSerializable[6])();
    pXVar12 = (XSMultiValueFacet *)XMemory::operator_new(0x40,this->fMemoryManager);
    pXVar13 = getAnnotationFromModel(this,xsModel,(StringList *)CONCAT44(extraout_var_01,iVar8));
    local_104 = (FVar4 & FACET_WHITESPACE) >> 4;
    XSMultiValueFacet::XSMultiValueFacet
              (pXVar12,FACET_ENUMERATION,(StringList *)CONCAT44(extraout_var_01,iVar8),
               SUB41(local_104,0),pXVar13,xsModel,this->fMemoryManager);
    fixedFacets = (FVar4 & FACET_WHITESPACE) << 7;
    pBVar7 = &this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>;
    BaseRefVectorOf<xercesc_4_0::XSObject>::ensureExtraCapacity(pBVar7,1);
    XVar19 = pBVar7->fCurCount;
    pBVar7->fElemList[XVar19] = (XSObject *)pXVar12;
    pBVar7->fCurCount = XVar19 + 1;
    BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::ensureExtraCapacity(this_03,1);
    XVar19 = this_03->fCurCount;
    this_03->fElemList[XVar19] = pXVar12;
    this_03->fCurCount = XVar19 + 1;
    local_dc = FACET_ENUMERATION;
  }
  if (dv->fFacets == (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
    local_e8 = (BaseRefVectorOf<char16_t> *)0x0;
  }
  else {
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    RefHashTableOfEnumerator(&local_90,dv->fFacets,false,this->fMemoryManager);
    bVar17 = (byte)FVar4;
    local_e8 = (BaseRefVectorOf<char16_t> *)0x0;
    while ((local_90.fCurElem != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0 ||
           (local_90.fCurHash != (local_90.fToEnum)->fHashModulus))) {
      key = RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
            nextElement(&local_90);
      pXVar16 = key->fKey;
      pXVar13 = getAnnotationFromModel(this,xsModel,key);
      facetKind = FACET_MAXINCLUSIVE;
      if (pXVar16 == L"maxInclusive") {
LAB_002d01ae:
        FVar9 = (FACET)(bVar17 >> 5);
LAB_002d01e8:
        pXVar15 = (XSFacet *)XMemory::operator_new(0x40,this->fMemoryManager);
        local_104._0_1_ = (undefined1)FVar9;
        XSFacet::XSFacet(pXVar15,facetKind,key->fValue,(bool)((undefined1)local_104 & 1),pXVar13,
                         xsModel,this->fMemoryManager);
        pBVar7 = &this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>;
        BaseRefVectorOf<xercesc_4_0::XSObject>::ensureExtraCapacity(pBVar7,1);
        XVar19 = pBVar7->fCurCount;
        pBVar7->fElemList[XVar19] = (XSObject *)pXVar15;
        pBVar7->fCurCount = XVar19 + 1;
        BaseRefVectorOf<xercesc_4_0::XSFacet>::ensureExtraCapacity(this_02,1);
        XVar19 = this_02->fCurCount;
        this_02->fElemList[XVar19] = pXVar15;
        this_02->fCurCount = XVar19 + 1;
        local_dc = local_dc | facetKind;
        if ((FVar9 & FACET_LENGTH) == FACET_NONE) {
          facetKind = FACET_NONE;
        }
        fixedFacets = fixedFacets | facetKind;
        local_104 = FVar9;
      }
      else {
        pXVar14 = L"maxInclusive";
        pXVar18 = pXVar16;
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002cfef9:
          if (*pXVar14 == L'\0') goto LAB_002d01ae;
        }
        else {
          do {
            XVar2 = *pXVar18;
            if (XVar2 == L'\0') goto LAB_002cfef9;
            XVar3 = *pXVar14;
            pXVar14 = pXVar14 + 1;
            pXVar18 = pXVar18 + 1;
          } while (XVar2 == XVar3);
        }
        facetKind = FACET_MAXEXCLUSIVE;
        if (pXVar16 == L"maxExclusive") {
LAB_002d01b4:
          FVar9 = (FACET)(bVar17 >> 6);
          goto LAB_002d01e8;
        }
        pXVar14 = L"maxExclusive";
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002cff40:
          if (*pXVar14 == L'\0') goto LAB_002d01b4;
        }
        else {
          pXVar14 = L"maxExclusive";
          pXVar18 = pXVar16;
          do {
            XVar2 = *pXVar18;
            if (XVar2 == L'\0') goto LAB_002cff40;
            pXVar18 = pXVar18 + 1;
            XVar3 = *pXVar14;
            pXVar14 = pXVar14 + 1;
          } while (XVar2 == XVar3);
        }
        facetKind = FACET_MININCLUSIVE;
        if (pXVar16 == L"minInclusive") {
LAB_002d01ba:
          FVar9 = (FACET)(bVar17 >> 7);
          goto LAB_002d01e8;
        }
        pXVar14 = L"minInclusive";
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002cff87:
          if (*pXVar14 == L'\0') goto LAB_002d01ba;
        }
        else {
          pXVar14 = L"minInclusive";
          pXVar18 = pXVar16;
          do {
            XVar2 = *pXVar18;
            if (XVar2 == L'\0') goto LAB_002cff87;
            pXVar18 = pXVar18 + 1;
            XVar3 = *pXVar14;
            pXVar14 = pXVar14 + 1;
          } while (XVar2 == XVar3);
        }
        facetKind = FACET_MINEXCLUSIVE;
        FVar9 = FVar4 >> 8;
        if (pXVar16 == L"minExclusive") goto LAB_002d01e8;
        pXVar14 = L"minExclusive";
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002cffce:
          if (*pXVar14 == L'\0') goto LAB_002d01e8;
        }
        else {
          pXVar14 = L"minExclusive";
          pXVar18 = pXVar16;
          do {
            XVar2 = *pXVar18;
            if (XVar2 == L'\0') goto LAB_002cffce;
            pXVar18 = pXVar18 + 1;
            XVar3 = *pXVar14;
            pXVar14 = pXVar14 + 1;
          } while (XVar2 == XVar3);
        }
        facetKind = FACET_LENGTH;
        FVar9 = FVar4;
        if (pXVar16 == L"length") goto LAB_002d01e8;
        pXVar14 = L"length";
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002d0015:
          if (*pXVar14 == L'\0') goto LAB_002d01e8;
        }
        else {
          pXVar14 = L"length";
          pXVar18 = pXVar16;
          do {
            XVar2 = *pXVar18;
            if (XVar2 == L'\0') goto LAB_002d0015;
            pXVar18 = pXVar18 + 1;
            XVar3 = *pXVar14;
            pXVar14 = pXVar14 + 1;
          } while (XVar2 == XVar3);
        }
        facetKind = FACET_MINLENGTH;
        if (pXVar16 == L"minLength") {
LAB_002d01cc:
          FVar9 = (FACET)(bVar17 >> 1);
          goto LAB_002d01e8;
        }
        pXVar14 = L"minLength";
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002d005c:
          if (*pXVar14 == L'\0') goto LAB_002d01cc;
        }
        else {
          pXVar14 = L"minLength";
          pXVar18 = pXVar16;
          do {
            XVar2 = *pXVar18;
            if (XVar2 == L'\0') goto LAB_002d005c;
            pXVar18 = pXVar18 + 1;
            XVar3 = *pXVar14;
            pXVar14 = pXVar14 + 1;
          } while (XVar2 == XVar3);
        }
        facetKind = FACET_MAXLENGTH;
        if (pXVar16 == L"maxLength") {
LAB_002d01d2:
          FVar9 = (FACET)(bVar17 >> 2);
          goto LAB_002d01e8;
        }
        pXVar14 = L"maxLength";
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002d00a3:
          if (*pXVar14 == L'\0') goto LAB_002d01d2;
        }
        else {
          pXVar14 = L"maxLength";
          pXVar18 = pXVar16;
          do {
            XVar2 = *pXVar18;
            if (XVar2 == L'\0') goto LAB_002d00a3;
            pXVar18 = pXVar18 + 1;
            XVar3 = *pXVar14;
            pXVar14 = pXVar14 + 1;
          } while (XVar2 == XVar3);
        }
        facetKind = FACET_TOTALDIGITS;
        FVar9 = FVar4 >> 9;
        if (pXVar16 == L"totalDigits") goto LAB_002d01e8;
        pXVar14 = L"totalDigits";
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002d00ea:
          if (*pXVar14 == L'\0') goto LAB_002d01e8;
        }
        else {
          pXVar14 = L"totalDigits";
          pXVar18 = pXVar16;
          do {
            XVar2 = *pXVar18;
            if (XVar2 == L'\0') goto LAB_002d00ea;
            pXVar18 = pXVar18 + 1;
            XVar3 = *pXVar14;
            pXVar14 = pXVar14 + 1;
          } while (XVar2 == XVar3);
        }
        facetKind = FACET_FRACTIONDIGITS;
        FVar9 = FVar4 >> 10;
        if (pXVar16 == L"fractionDigits") goto LAB_002d01e8;
        pXVar14 = L"fractionDigits";
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002d0138:
          if (*pXVar14 == L'\0') goto LAB_002d01e8;
        }
        else {
          pXVar14 = L"fractionDigits";
          pXVar18 = pXVar16;
          do {
            XVar2 = *pXVar18;
            if (XVar2 == L'\0') goto LAB_002d0138;
            pXVar18 = pXVar18 + 1;
            XVar3 = *pXVar14;
            pXVar14 = pXVar14 + 1;
          } while (XVar2 == XVar3);
        }
        facetKind = FACET_WHITESPACE;
        FVar9 = FVar4 >> 0xe;
        if (pXVar16 == L"whiteSpace") goto LAB_002d01e8;
        pXVar14 = L"whiteSpace";
        if (pXVar16 == (XMLCh *)0x0) {
LAB_002d0178:
          if (*pXVar14 == L'\0') goto LAB_002d01e8;
        }
        else {
          pXVar14 = L"whiteSpace";
          pXVar18 = pXVar16;
          do {
            XVar2 = *pXVar18;
            if (XVar2 == L'\0') goto LAB_002d0178;
            pXVar18 = pXVar18 + 1;
            XVar3 = *pXVar14;
            pXVar14 = pXVar14 + 1;
          } while (XVar2 == XVar3);
        }
        bVar21 = XMLString::equals(pXVar16,L"pattern");
        if ((this_03 != (BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)0x0) && (bVar21)) {
          XMLStringTokenizer::XMLStringTokenizer
                    (&local_60,dv->fPattern,(XMLCh *)&regexSeparator,this->fMemoryManager);
          local_e8 = (BaseRefVectorOf<char16_t> *)XMemory::operator_new(0x30,this->fMemoryManager);
          uVar10 = XMLStringTokenizer::countTokens(&local_60);
          BaseRefVectorOf<char16_t>::BaseRefVectorOf
                    (local_e8,(ulong)uVar10,true,this->fMemoryManager);
          local_e8->_vptr_BaseRefVectorOf = (_func_int **)&PTR__RefArrayVectorOf_0040c128;
          while (bVar21 = XMLStringTokenizer::hasMoreTokens(&local_60), bVar21) {
            pXVar16 = XMLStringTokenizer::nextToken(&local_60);
            if (pXVar16 == (XMLCh *)0x0) {
              __dest = (char16_t *)0x0;
            }
            else {
              __n = 0;
              do {
                psVar1 = (short *)((long)pXVar16 + __n);
                __n = __n + 2;
              } while (*psVar1 != 0);
              iVar8 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
              __dest = (char16_t *)CONCAT44(extraout_var_02,iVar8);
              memcpy(__dest,pXVar16,__n);
            }
            BaseRefVectorOf<char16_t>::ensureExtraCapacity(local_e8,1);
            XVar19 = local_e8->fCurCount;
            local_e8->fElemList[XVar19] = __dest;
            local_e8->fCurCount = XVar19 + 1;
          }
          local_104 = local_104 &
                      (FACET_MINEXCLUSIVE|FACET_MAXEXCLUSIVE|FACET_MAXINCLUSIVE|FACET_WHITESPACE|
                       FACET_PATTERN|FACET_MAXLENGTH|FACET_MINLENGTH|FACET_LENGTH);
          if ((FVar4 & FACET_PATTERN) != FACET_NONE) {
            local_104 = FACET_LENGTH;
          }
          pXVar12 = (XSMultiValueFacet *)XMemory::operator_new(0x40,this->fMemoryManager);
          XSMultiValueFacet::XSMultiValueFacet
                    (pXVar12,FACET_PATTERN,(StringList *)local_e8,(bool)((undefined1)local_104 & 1),
                     pXVar13,xsModel,this->fMemoryManager);
          pBVar7 = &this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>;
          BaseRefVectorOf<xercesc_4_0::XSObject>::ensureExtraCapacity(pBVar7,1);
          XVar19 = pBVar7->fCurCount;
          pBVar7->fElemList[XVar19] = (XSObject *)pXVar12;
          pBVar7->fCurCount = XVar19 + 1;
          BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::ensureExtraCapacity(this_03,1);
          fixedFacets = fixedFacets | FVar4 & FACET_PATTERN;
          XVar19 = this_03->fCurCount;
          this_03->fElemList[XVar19] = pXVar12;
          this_03->fCurCount = XVar19 + 1;
          local_dc = local_dc | FACET_PATTERN;
          XMLStringTokenizer::~XMLStringTokenizer(&local_60);
        }
      }
    }
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator(&local_90);
  }
  if ((local_dc & FACET_WHITESPACE) == FACET_NONE) {
    pXVar15 = (XSFacet *)XMemory::operator_new(0x40,this->fMemoryManager);
    pXVar16 = DatatypeValidator::getWSstring(dv,dv->fWhiteSpace);
    XSFacet::XSFacet(pXVar15,FACET_WHITESPACE,pXVar16,false,(XSAnnotation *)0x0,xsModel,
                     this->fMemoryManager);
    pBVar7 = &this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>;
    BaseRefVectorOf<xercesc_4_0::XSObject>::ensureExtraCapacity(pBVar7,1);
    XVar19 = pBVar7->fCurCount;
    pBVar7->fElemList[XVar19] = (XSObject *)pXVar15;
    pBVar7->fCurCount = XVar19 + 1;
    BaseRefVectorOf<xercesc_4_0::XSFacet>::ensureExtraCapacity(this_02,1);
    XVar19 = this_02->fCurCount;
    this_02->fElemList[XVar19] = pXVar15;
    this_02->fCurCount = XVar19 + 1;
    local_dc = local_dc | FACET_WHITESPACE;
  }
  iVar8 = (*(xsST->super_XSTypeDefinition).super_XSObject._vptr_XSObject[6])(xsST);
  if ((CONCAT44(extraout_var_03,iVar8) != 0) &&
     (iVar8 = (*(xsST->super_XSTypeDefinition).super_XSObject._vptr_XSObject[6])(xsST),
     *(int *)(CONCAT44(extraout_var_04,iVar8) + 0x28) == 0x10)) {
    iVar8 = (*(xsST->super_XSTypeDefinition).super_XSObject._vptr_XSObject[6])(xsST);
    this_00 = *(BaseRefVectorOf<xercesc_4_0::XSFacet> **)(CONCAT44(extraout_var_05,iVar8) + 0x50);
    if (this_00->fCurCount != 0) {
      XVar19 = 0;
      uVar20 = 1;
      do {
        pXVar15 = BaseRefVectorOf<xercesc_4_0::XSFacet>::elementAt(this_00,XVar19);
        if ((pXVar15->fFacetKind & local_dc) == FACET_NONE) {
          local_dc = pXVar15->fFacetKind | local_dc;
          BaseRefVectorOf<xercesc_4_0::XSFacet>::ensureExtraCapacity(this_02,1);
          XVar19 = this_02->fCurCount;
          this_02->fElemList[XVar19] = pXVar15;
          this_02->fCurCount = XVar19 + 1;
          if (pXVar15->fIsFixed == true) {
            fixedFacets = fixedFacets | pXVar15->fFacetKind;
          }
        }
        bVar21 = uVar20 < this_00->fCurCount;
        XVar19 = uVar20;
        uVar20 = (ulong)((int)uVar20 + 1);
      } while (bVar21);
    }
    if (((this_03 != (BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)0x0) &&
        (this_01 = *(BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> **)
                    (CONCAT44(extraout_var_05,iVar8) + 0x58),
        this_01 != (BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)0x0)) &&
       (this_01->fCurCount != 0)) {
      XVar19 = 0;
      uVar20 = 1;
      do {
        pXVar12 = BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::elementAt(this_01,XVar19);
        if ((pXVar12->fFacetKind & local_dc) == FACET_NONE) {
          local_dc = pXVar12->fFacetKind | local_dc;
          BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::ensureExtraCapacity(this_03,1);
          XVar19 = this_03->fCurCount;
          this_03->fElemList[XVar19] = pXVar12;
          this_03->fCurCount = XVar19 + 1;
          if (pXVar12->fIsFixed == true) {
            fixedFacets = fixedFacets | pXVar12->fFacetKind;
          }
        }
        bVar21 = uVar20 < this_01->fCurCount;
        XVar19 = uVar20;
        uVar20 = (ulong)((int)uVar20 + 1);
      } while (bVar21);
    }
  }
  XSSimpleTypeDefinition::setFacetInfo
            (xsST,local_dc,fixedFacets,(XSFacetList *)this_02,(XSMultiValueFacetList *)this_03,
             (StringList *)local_e8);
  return;
}

Assistant:

void XSObjectFactory::processFacets(DatatypeValidator* const dv,
                                    XSModel* const xsModel,
                                    XSSimpleTypeDefinition* const xsST)
{
    // NOTE: XSMultiValueFacetList is not owned by XSModel!
    // NOTE: XSFacetList is not owned by XSModel!
    bool isFixed = false;
    int dvFacetsDefined = dv->getFacetsDefined();
    int dvFixedFacets = dv->getFixed();
    int definedFacets = 0;
    int fixedFacets = 0;
    XSMultiValueFacetList* xsMultiFacetList = 0;
    StringList* patternList = 0;
    XSFacetList* xsFacetList = new (fMemoryManager) RefVectorOf<XSFacet>(4, false, fMemoryManager);

    if (isMultiValueFacetDefined(dv))
        xsMultiFacetList = new (fMemoryManager) RefVectorOf<XSMultiValueFacet>(2, false, fMemoryManager);

    if (dvFacetsDefined & DatatypeValidator::FACET_ENUMERATION)
    {
        RefArrayVectorOf<XMLCh>* enumList = (RefArrayVectorOf<XMLCh>*) dv->getEnumString();

        if (dvFixedFacets & DatatypeValidator::FACET_ENUMERATION)
        {
            isFixed = true;
            fixedFacets |= XSSimpleTypeDefinition::FACET_ENUMERATION;
        }

        XSMultiValueFacet* mvFacet = new (fMemoryManager) XSMultiValueFacet(
            XSSimpleTypeDefinition::FACET_ENUMERATION , enumList, isFixed
            , getAnnotationFromModel(xsModel, enumList), xsModel, fMemoryManager
        );

        fDeleteVector->addElement(mvFacet);
        xsMultiFacetList->addElement(mvFacet);
        definedFacets |= XSSimpleTypeDefinition::FACET_ENUMERATION;
    }

    if (dv->getFacets())
    {
        RefHashTableOfEnumerator<KVStringPair> e(dv->getFacets(), false, fMemoryManager);
        while (e.hasMoreElements())
        {
            KVStringPair& pair = e.nextElement();
            XMLCh* key = pair.getKey();
            XSSimpleTypeDefinition::FACET facetType;
            XSAnnotation* annot = getAnnotationFromModel(xsModel, &pair);

            if (XMLString::equals(key, SchemaSymbols::fgELT_MAXINCLUSIVE))
            {
                facetType = XSSimpleTypeDefinition::FACET_MAXINCLUSIVE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MAXINCLUSIVE) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MAXEXCLUSIVE))
            {
                facetType = XSSimpleTypeDefinition::FACET_MAXEXCLUSIVE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MAXEXCLUSIVE) !=0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MININCLUSIVE))
            {
                facetType = XSSimpleTypeDefinition::FACET_MININCLUSIVE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MININCLUSIVE) !=0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MINEXCLUSIVE))
            {
                facetType = XSSimpleTypeDefinition::FACET_MINEXCLUSIVE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MINEXCLUSIVE) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_LENGTH))
            {
                facetType = XSSimpleTypeDefinition::FACET_LENGTH;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_LENGTH) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MINLENGTH))
            {
                facetType = XSSimpleTypeDefinition::FACET_MINLENGTH;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MINLENGTH) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_MAXLENGTH))
            {
                facetType = XSSimpleTypeDefinition::FACET_MAXLENGTH;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_MAXLENGTH) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_TOTALDIGITS))
            {
                facetType = XSSimpleTypeDefinition::FACET_TOTALDIGITS;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_TOTALDIGITS) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_FRACTIONDIGITS))
            {
                facetType = XSSimpleTypeDefinition::FACET_FRACTIONDIGITS;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_FRACTIONDIGITS) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_WHITESPACE))
            {
                facetType = XSSimpleTypeDefinition::FACET_WHITESPACE;
                isFixed = ((dvFixedFacets & DatatypeValidator::FACET_WHITESPACE) != 0);
            }
            else if (XMLString::equals(key, SchemaSymbols::fgELT_PATTERN) && xsMultiFacetList)
            {
                XMLStringTokenizer tokenizer(dv->getPattern(), regexSeparator, fMemoryManager);
                patternList = new (fMemoryManager) RefArrayVectorOf<XMLCh>(
                    tokenizer.countTokens(), true, fMemoryManager
                );

                while (tokenizer.hasMoreTokens())
                    patternList->addElement(XMLString::replicate(tokenizer.nextToken(), fMemoryManager));

                if (dvFixedFacets & DatatypeValidator::FACET_PATTERN)
                {
                    isFixed = true;
                    fixedFacets |= XSSimpleTypeDefinition::FACET_PATTERN;
                }

                XSMultiValueFacet* mvFacet = new (fMemoryManager) XSMultiValueFacet(
                    XSSimpleTypeDefinition::FACET_PATTERN, patternList
                    , isFixed, annot, xsModel, fMemoryManager
                );
                fDeleteVector->addElement(mvFacet);
                xsMultiFacetList->addElement(mvFacet);
                definedFacets |= XSSimpleTypeDefinition::FACET_PATTERN;
                continue;
            }
            else
            {
                // REVISIT: hmm... what about XSSimpleTypeDefinition::FACET_NONE
                // don't think I need to create an empty Facet?
                continue;
            }

            XSFacet* xsFacet = new (fMemoryManager) XSFacet(
                facetType, pair.getValue(), isFixed, annot, xsModel, fMemoryManager);

            fDeleteVector->addElement(xsFacet);
            xsFacetList->addElement(xsFacet);
            definedFacets |= facetType;
            if (isFixed)
                fixedFacets |= facetType;
        }
    }

    // add whistespace facet if missing
    if ((definedFacets & XSSimpleTypeDefinition::FACET_WHITESPACE) == 0)
    {
        XSFacet* xsFacet = new (fMemoryManager) XSFacet(
            XSSimpleTypeDefinition::FACET_WHITESPACE
            , dv->getWSstring(dv->getWSFacet())
            , false, 0, xsModel, fMemoryManager);

        fDeleteVector->addElement(xsFacet);
        xsFacetList->addElement(xsFacet);
        definedFacets |= XSSimpleTypeDefinition::FACET_WHITESPACE;
    }

    // inherit facets from base

    if (xsST->getBaseType() && xsST->getBaseType()->getTypeCategory() == XSTypeDefinition::SIMPLE_TYPE)
    {
        XSSimpleTypeDefinition* baseST = (XSSimpleTypeDefinition*) xsST->getBaseType();
        XSFacetList* baseFacets = baseST->getFacets();

        for (unsigned int i=0; i<baseFacets->size(); i++)
        {
            XSFacet* bFacet = baseFacets->elementAt(i);
            if ((definedFacets & bFacet->getFacetKind()) == 0)
            {
                definedFacets |= bFacet->getFacetKind();
                xsFacetList->addElement(bFacet);
                if (bFacet->isFixed())
                    fixedFacets |= bFacet->getFacetKind();
            }
        }

        if (baseST->getMultiValueFacets() && xsMultiFacetList)
        {
            XSMultiValueFacetList* baseMVFacets = baseST->getMultiValueFacets();
            for (unsigned int j=0; j<baseMVFacets->size(); j++)
            {
                XSMultiValueFacet* bFacet = baseMVFacets->elementAt(j);
                if ((definedFacets & bFacet->getFacetKind()) == 0)
                {
                    definedFacets |= bFacet->getFacetKind();
                    xsMultiFacetList->addElement(bFacet);
                    if (bFacet->isFixed())
                        fixedFacets |= bFacet->getFacetKind();
                }
            }
        }
    }

    xsST->setFacetInfo(definedFacets, fixedFacets, xsFacetList, xsMultiFacetList, patternList);
}